

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

int i4vec_unique_count(int n,int *a)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  if (n < 1) {
    iVar1 = 0;
  }
  else {
    uVar2 = 0;
    iVar3 = 0;
    do {
      iVar1 = iVar3 + 1;
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          iVar1 = iVar3;
          if (a[uVar2] == a[uVar4]) break;
          uVar4 = uVar4 + 1;
          iVar1 = iVar3 + 1;
        } while (uVar2 != uVar4);
      }
      uVar2 = uVar2 + 1;
      iVar3 = iVar1;
    } while (uVar2 != (uint)n);
  }
  return iVar1;
}

Assistant:

int i4vec_unique_count ( int n, int a[] )

//****************************************************************************80
//
//  Purpose:
//
//    I4VEC_UNIQUE_COUNT counts the unique elements in an unsorted I4VEC.
//
//  Discussion:
//
//    An I4VEC is a vector of I4's.
//
//    Because the array is unsorted, this algorithm is O(N^2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 April 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of elements of A.
//
//    Input, int A[N], the array to examine, which does NOT have to
//    be sorted.
//
//    Output, int I4VEC_UNIQUE_COUNT, the number of unique elements of A.
//
{
  int i;
  int j;
  int unique_num;

  unique_num = 0;

  for ( i = 0; i < n; i++ )
  {
    unique_num = unique_num + 1;

    for ( j = 0; j < i; j++ )
    {
      if ( a[i] == a[j] )
      {
        unique_num = unique_num - 1;
        break;
      }
    }
  }

  return unique_num;
}